

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

void __thiscall QDialogButtonBox::~QDialogButtonBox(QDialogButtonBox *this)

{
  QDialogButtonBox *in_stack_00000010;
  
  ~QDialogButtonBox(in_stack_00000010);
  return;
}

Assistant:

QDialogButtonBox::~QDialogButtonBox()
{
    Q_D(QDialogButtonBox);

    d->ignoreShowAndHide = true;

    // QObjectPrivate::connect requires explicit disconnect in destructor
    // otherwise the connection may kick in on child destruction and reach
    // the parent's destroyed private object
    d->disconnectAll();
    // ditto event filter:
    d->filter.reset();
}